

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int lookup_certificate(ptls_lookup_certificate_t *_self,ptls_t *tls,uint16_t *sign_algorithm,
                      _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **signer,void **signer_data,
                      ptls_iovec_t **certs,size_t *num_certs,char *server_name,
                      uint16_t *signature_algorithms,size_t num_signature_algorithms)

{
  uint16_t *puVar1;
  long lVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  
  iVar4 = 0x28;
  if (_self[2].cb !=
      (_func_int_st_ptls_lookup_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr__func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_ptr_size_t_ptr_char_ptr_uint16_t_ptr_size_t
       *)0x0) {
    lVar2 = *(long *)_self[1].cb;
    iVar4 = EVP_PKEY_get_id(*(undefined8 *)(lVar2 + 0x10));
    if (iVar4 == 6) {
      sVar5 = 0;
      do {
        if (num_signature_algorithms == sVar5) goto LAB_00104626;
        puVar1 = signature_algorithms + sVar5;
        sVar5 = sVar5 + 1;
      } while (*puVar1 != 0x804);
      uVar3 = 0x804;
    }
    else {
      if (iVar4 != 0x198) {
        __assert_fail("!\"logic flaw\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/openssl.c"
                      ,0x231,
                      "uint16_t select_compatible_signature_algorithm(EVP_PKEY *, const uint16_t *, size_t)"
                     );
      }
      sVar5 = 0;
      do {
        if (num_signature_algorithms == sVar5) {
LAB_00104626:
          *sign_algorithm = 0xffff;
          return 0x28;
        }
        puVar1 = signature_algorithms + sVar5;
        sVar5 = sVar5 + 1;
      } while (*puVar1 != 0x403);
      uVar3 = 0x403;
    }
    *sign_algorithm = uVar3;
    *signer = rsapss_sign;
    *signer_data = *(void **)(lVar2 + 0x10);
    *certs = (ptls_iovec_t *)(lVar2 + 0x20);
    *num_certs = *(size_t *)(lVar2 + 0x18);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int lookup_certificate(ptls_lookup_certificate_t *_self, ptls_t *tls, uint16_t *sign_algorithm,
                              int (**signer)(void *sign_ctx, ptls_buffer_t *outbuf, ptls_iovec_t input), void **signer_data,
                              ptls_iovec_t **certs, size_t *num_certs, const char *server_name,
                              const uint16_t *signature_algorithms, size_t num_signature_algorithms)
{
    ptls_openssl_lookup_certificate_t *self = (ptls_openssl_lookup_certificate_t *)_self;
    struct st_ptls_openssl_identity_t *identity;

    if (self->count == 0)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    if (server_name != NULL) {
        size_t i, server_name_len = strlen(server_name);
        for (i = 0; i != self->count; ++i) {
            identity = self->identities[i];
            if (ascii_streq_caseless(ptls_iovec_init(server_name, server_name_len), identity->name) &&
                (*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms,
                                                                         num_signature_algorithms)) != UINT16_MAX)
                goto Found;
        }
    }
    /* not found, use the first one, if the signing algorithm matches */
    identity = self->identities[0];
    if ((*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms, num_signature_algorithms)) ==
        UINT16_MAX)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    /* setup the rest */
    *signer = rsapss_sign;
    *signer_data = identity->key;
    *certs = identity->certs;
    *num_certs = identity->num_certs;

    return 0;
}